

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O3

Operator __thiscall
calculator::ExpressionParser<__int128>::parseOp(ExpressionParser<__int128> *this)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  Operator OVar10;
  string local_38;
  
  eatSpaces(this);
  uVar3 = (this->expr_)._M_string_length;
  uVar4 = this->index_;
  iVar9 = 0x4c;
  if (uVar4 < uVar3) {
    pcVar5 = (this->expr_)._M_dataplus._M_p;
    bVar2 = pcVar5[uVar4];
    uVar6 = 0;
    if (0x3b < bVar2) {
      if (bVar2 < 0x5e) {
        if (bVar2 == 0x3c) {
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<<","");
          expect(this,&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
          uVar7 = 0x900000000;
          uVar6 = 4;
          goto LAB_00118196;
        }
        if (bVar2 == 0x3e) {
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,">>","");
          expect(this,&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_38._M_dataplus._M_p != &local_38.field_2) {
            operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
          }
          uVar7 = 0x900000000;
          uVar6 = 5;
          goto LAB_00118196;
        }
        uVar7 = 0;
        if (bVar2 != 0x45) goto LAB_00118196;
      }
      else {
        if (bVar2 == 0x5e) {
          sVar8 = uVar4 + 1;
          goto LAB_00118318;
        }
        if (bVar2 != 0x65) {
          if (bVar2 == 0x7c) {
            this->index_ = uVar4 + 1;
            uVar7 = 0x400000000;
            uVar6 = 1;
            goto LAB_00118196;
          }
          goto switchD_00118178_caseD_27;
        }
      }
      uVar7 = 0x2800000000;
      this->index_ = uVar4 + 1;
      iVar9 = 0x52;
      uVar6 = 0xc;
      goto LAB_00118196;
    }
    switch(bVar2) {
    case 0x25:
      uVar7 = 0x1400000000;
      this->index_ = uVar4 + 1;
      uVar6 = 10;
      break;
    case 0x26:
      this->index_ = uVar4 + 1;
      uVar7 = 0x600000000;
      uVar6 = 3;
      break;
    default:
      goto switchD_00118178_caseD_27;
    case 0x2a:
      uVar7 = 0x1400000000;
      uVar1 = uVar4 + 1;
      this->index_ = uVar1;
      uVar6 = 8;
      if ((uVar3 <= uVar1) || (pcVar5[uVar1] != '*')) break;
      sVar8 = uVar4 + 2;
LAB_00118318:
      uVar7 = 0x1e00000000;
      this->index_ = sVar8;
      iVar9 = 0x52;
      uVar6 = 0xb;
      break;
    case 0x2b:
      uVar7 = 0xa00000000;
      this->index_ = uVar4 + 1;
      uVar6 = 6;
      break;
    case 0x2d:
      uVar7 = 0xa00000000;
      this->index_ = uVar4 + 1;
      uVar6 = 7;
      break;
    case 0x2f:
      uVar7 = 0x1400000000;
      this->index_ = uVar4 + 1;
      uVar6 = 9;
    }
  }
  else {
switchD_00118178_caseD_27:
    uVar6 = 0;
    uVar7 = 0;
  }
LAB_00118196:
  OVar10._0_8_ = uVar6 | uVar7;
  OVar10.associativity = iVar9;
  return OVar10;
}

Assistant:

Operator parseOp()
  {
    eatSpaces();
    switch (getCharacter())
    {
      case '|': index_++;     return Operator(OPERATOR_BITWISE_OR,      4, 'L');
      case '&': index_++;     return Operator(OPERATOR_BITWISE_AND,     6, 'L');
      case '<': expect("<<"); return Operator(OPERATOR_BITWISE_SHL,     9, 'L');
      case '>': expect(">>"); return Operator(OPERATOR_BITWISE_SHR,     9, 'L');
      case '+': index_++;     return Operator(OPERATOR_ADDITION,       10, 'L');
      case '-': index_++;     return Operator(OPERATOR_SUBTRACTION,    10, 'L');
      case '/': index_++;     return Operator(OPERATOR_DIVISION,       20, 'L');
      case '%': index_++;     return Operator(OPERATOR_MODULO,         20, 'L');
      case '*': index_++; if (getCharacter() != '*')
                              return Operator(OPERATOR_MULTIPLICATION, 20, 'L');
                index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case '^': index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case 'e': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      case 'E': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      default :               return Operator(OPERATOR_NULL,            0, 'L');
    }
  }